

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryption.cc
# Opt level: O0

fdb_status fdb_init_encryptor(encryptor *e,fdb_encryption_key *key)

{
  encryption_ops *peVar1;
  int *in_RSI;
  long *in_RDI;
  fdb_status local_4;
  
  if (*in_RSI == 0) {
    *in_RDI = 0;
    local_4 = FDB_RESULT_SUCCESS;
  }
  else {
    peVar1 = get_encryption_ops(*in_RSI);
    *in_RDI = (long)peVar1;
    if (*in_RDI == 0) {
      local_4 = FDB_RESULT_CRYPTO_ERROR;
    }
    else {
      memcpy(in_RDI + 1,in_RSI,0x24);
      local_4 = (**(code **)*in_RDI)(in_RDI);
    }
  }
  return local_4;
}

Assistant:

fdb_status fdb_init_encryptor(encryptor *e,
                              const fdb_encryption_key *key)
{
    if (key->algorithm == FDB_ENCRYPTION_NONE) {
        e->ops = NULL;
        return FDB_RESULT_SUCCESS;
    }
#ifdef FDB_LOG_CRYPTO
    fprintf(stderr, "CRYPT: Initializing context for key %d:%llx\n",
            key->algorithm, *(uint64_t*)key->bytes);
#endif
    e->ops = get_encryption_ops(key->algorithm);
    if (!e->ops)
        return FDB_RESULT_CRYPTO_ERROR; // unsupported algorithm
    e->key = *key;
    return e->ops->setup(e);
}